

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.c
# Opt level: O3

void curses_print_message_core(wchar_t turn,char *msg,nh_bool canblock)

{
  char *pcVar1;
  undefined1 auVar2 [16];
  char **wrap_output;
  wchar_t wVar3;
  wchar_t wVar4;
  int iVar5;
  size_t sVar6;
  size_t sVar7;
  long lVar8;
  long lVar9;
  short sVar10;
  undefined7 in_register_00000011;
  wchar_t wVar11;
  wchar_t wVar12;
  message *pmVar13;
  wchar_t wVar14;
  long lVar15;
  char (*pacVar16) [81];
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int iVar27;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  wchar_t output_count;
  char **output;
  wchar_t local_54;
  char *local_50;
  undefined4 local_48;
  wchar_t local_44;
  char **local_40;
  message *local_38;
  
  local_48 = (undefined4)CONCAT71(in_register_00000011,canblock);
  local_50 = msg;
  if (msghistory == (message *)0x0) {
    alloc_hist_array();
  }
  wVar14 = histsize;
  pmVar13 = msghistory;
  if ((turn < prevturn) && (msghistory != (message *)0x0)) {
    lVar15 = (long)histpos;
    wVar11 = histpos;
    if (L'\0' < histsize && turn <= msghistory[lVar15].turn) {
      wVar12 = L'\x01';
      do {
        pmVar13[lVar15].turn = 0;
        if (pmVar13[lVar15].msg != (char *)0x0) {
          free(pmVar13[lVar15].msg);
          pmVar13[lVar15].msg = (char *)0x0;
        }
        wVar3 = wVar14;
        if (L'\0' < wVar11) {
          wVar3 = L'\0';
        }
        wVar11 = wVar11 + wVar3 + L'\xffffffff';
        lVar15 = (long)wVar11;
      } while ((turn <= pmVar13[lVar15].turn) &&
              (bVar17 = wVar12 < wVar14, wVar12 = wVar12 + L'\x01', bVar17));
    }
    histpos = wVar11;
    wVar11 = histpos;
    auVar2 = _DAT_0011b520;
    curline = L'\0';
    lVar15 = 0;
    auVar18 = _DAT_0011b4f0;
    auVar19 = _DAT_0011b500;
    auVar20 = _DAT_0011b2b0;
    auVar21 = _DAT_0011b2c0;
    do {
      auVar22 = auVar21 ^ auVar2;
      iVar5 = auVar22._0_4_;
      iVar27 = auVar22._8_4_;
      auVar28._4_4_ = iVar5;
      auVar28._0_4_ = iVar5;
      auVar28._8_4_ = iVar27;
      auVar28._12_4_ = iVar27;
      auVar32._0_4_ = -(uint)(iVar5 < -0x7fffffd8);
      auVar32._4_4_ = -(uint)(iVar5 < -0x7fffffd8);
      auVar32._8_4_ = -(uint)(iVar27 < -0x7fffffd8);
      auVar32._12_4_ = -(uint)(iVar27 < -0x7fffffd8);
      auVar23._0_4_ = -(uint)(auVar22._4_4_ == -0x80000000);
      auVar23._4_4_ = -(uint)(auVar22._4_4_ == -0x80000000);
      auVar23._8_4_ = -(uint)(auVar22._12_4_ == -0x80000000);
      auVar23._12_4_ = -(uint)(auVar22._12_4_ == -0x80000000);
      auVar23 = auVar23 & auVar32;
      auVar22 = pshuflw(auVar28,auVar23,0xe8);
      auVar22 = packssdw(auVar22,auVar22);
      if ((auVar22 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        msglines[0][lVar15] = '\0';
      }
      auVar22 = packssdw(auVar23,auVar23);
      auVar22 = packssdw(auVar22,auVar22);
      if ((auVar22._0_4_ >> 0x10 & 1) != 0) {
        msglines[1][lVar15] = '\0';
      }
      auVar22 = auVar20 ^ auVar2;
      iVar5 = auVar22._0_4_;
      iVar27 = auVar22._8_4_;
      auVar29._4_4_ = iVar5;
      auVar29._0_4_ = iVar5;
      auVar29._8_4_ = iVar27;
      auVar29._12_4_ = iVar27;
      auVar33._0_4_ = -(uint)(iVar5 < -0x7fffffd8);
      auVar33._4_4_ = -(uint)(iVar5 < -0x7fffffd8);
      auVar33._8_4_ = -(uint)(iVar27 < -0x7fffffd8);
      auVar33._12_4_ = -(uint)(iVar27 < -0x7fffffd8);
      auVar24._0_4_ = -(uint)(auVar22._4_4_ == -0x80000000);
      auVar24._4_4_ = -(uint)(auVar22._4_4_ == -0x80000000);
      auVar24._8_4_ = -(uint)(auVar22._12_4_ == -0x80000000);
      auVar24._12_4_ = -(uint)(auVar22._12_4_ == -0x80000000);
      auVar24 = auVar24 & auVar33;
      auVar22 = packssdw(auVar29,auVar24);
      auVar22 = packssdw(auVar22,auVar22);
      if ((auVar22 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        msglines[2][lVar15] = '\0';
      }
      auVar22 = pshufhw(auVar24,auVar24,0x84);
      auVar22 = packssdw(auVar22,auVar22);
      if ((auVar22 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        msglines[3][lVar15] = '\0';
      }
      auVar22 = auVar19 ^ auVar2;
      iVar5 = auVar22._0_4_;
      iVar27 = auVar22._8_4_;
      auVar30._4_4_ = iVar5;
      auVar30._0_4_ = iVar5;
      auVar30._8_4_ = iVar27;
      auVar30._12_4_ = iVar27;
      auVar34._0_4_ = -(uint)(iVar5 < -0x7fffffd8);
      auVar34._4_4_ = -(uint)(iVar5 < -0x7fffffd8);
      auVar34._8_4_ = -(uint)(iVar27 < -0x7fffffd8);
      auVar34._12_4_ = -(uint)(iVar27 < -0x7fffffd8);
      auVar25._0_4_ = -(uint)(auVar22._4_4_ == -0x80000000);
      auVar25._4_4_ = -(uint)(auVar22._4_4_ == -0x80000000);
      auVar25._8_4_ = -(uint)(auVar22._12_4_ == -0x80000000);
      auVar25._12_4_ = -(uint)(auVar22._12_4_ == -0x80000000);
      auVar25 = auVar25 & auVar34;
      auVar22 = pshuflw(auVar30,auVar25,0xe8);
      auVar22 = packssdw(auVar22,auVar22);
      if ((auVar22 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        msglines[4][lVar15] = '\0';
      }
      auVar22 = packssdw(auVar25,auVar25);
      auVar22 = packssdw(auVar22,auVar22);
      if ((auVar22 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        msglines[5][lVar15] = '\0';
      }
      auVar22 = auVar18 ^ auVar2;
      iVar5 = auVar22._0_4_;
      iVar27 = auVar22._8_4_;
      auVar31._4_4_ = iVar5;
      auVar31._0_4_ = iVar5;
      auVar31._8_4_ = iVar27;
      auVar31._12_4_ = iVar27;
      auVar35._0_4_ = -(uint)(iVar5 < -0x7fffffd8);
      auVar35._4_4_ = -(uint)(iVar5 < -0x7fffffd8);
      auVar35._8_4_ = -(uint)(iVar27 < -0x7fffffd8);
      auVar35._12_4_ = -(uint)(iVar27 < -0x7fffffd8);
      auVar26._0_4_ = -(uint)(auVar22._4_4_ == -0x80000000);
      auVar26._4_4_ = -(uint)(auVar22._4_4_ == -0x80000000);
      auVar26._8_4_ = -(uint)(auVar22._12_4_ == -0x80000000);
      auVar26._12_4_ = -(uint)(auVar22._12_4_ == -0x80000000);
      auVar26 = auVar26 & auVar35;
      auVar22 = packssdw(auVar31,auVar26);
      auVar22 = packssdw(auVar22,auVar22);
      if ((auVar22 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        msglines[6][lVar15] = '\0';
      }
      auVar22 = pshufhw(auVar26,auVar26,0x84);
      auVar22 = packssdw(auVar22,auVar22);
      if ((auVar22 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        msglines[7][lVar15] = '\0';
      }
      lVar9 = auVar21._8_8_;
      auVar21._0_8_ = auVar21._0_8_ + 8;
      auVar21._8_8_ = lVar9 + 8;
      lVar9 = auVar20._8_8_;
      auVar20._0_8_ = auVar20._0_8_ + 8;
      auVar20._8_8_ = lVar9 + 8;
      lVar9 = auVar19._8_8_;
      auVar19._0_8_ = auVar19._0_8_ + 8;
      auVar19._8_8_ = lVar9 + 8;
      lVar9 = auVar18._8_8_;
      auVar18._0_8_ = auVar18._0_8_ + 8;
      auVar18._8_8_ = lVar9 + 8;
      lVar15 = lVar15 + 0x288;
    } while (lVar15 != 0xca8);
    if (L'\0' < wVar14) {
      wVar12 = L'\0';
      do {
        wVar4 = wVar11 + wVar12 + L'\x01';
        wVar3 = wVar14;
        if (wVar4 < wVar14) {
          wVar3 = L'\0';
        }
        iVar5 = wVar4 - wVar3;
        pcVar1 = pmVar13[iVar5].msg;
        if (pcVar1 != (char *)0x0) {
          if (prevturn < pmVar13[iVar5].turn) {
            last_redraw_curline = curline;
            start_of_turn_curline = curline;
          }
          lVar15 = (long)curline;
          pacVar16 = msglines + lVar15;
          prevturn = pmVar13[iVar5].turn;
          local_44 = wVar14;
          local_38 = pmVar13;
          sVar6 = strlen(*pacVar16);
          sVar7 = strlen(pcVar1);
          if (sVar7 + sVar6 + 2 < 0x50) {
            if ((*pacVar16)[0] != '\0') {
              sVar6 = strlen(*pacVar16);
              (*pacVar16 + sVar6)[0] = ' ';
              (*pacVar16 + sVar6)[1] = ' ';
              *(undefined1 *)(lVar15 * 0x51 + 0x1319b2 + sVar6) = 0;
            }
            strcat(*pacVar16,pcVar1);
            pmVar13 = local_38;
            wVar14 = local_44;
          }
          else {
            ui_wrap_text(L'P',pcVar1,&local_54,&local_40);
            wrap_output = local_40;
            lVar15 = (long)local_54;
            if (0 < lVar15) {
              lVar9 = 0;
              wVar14 = curline;
              do {
                lVar8 = (long)wVar14;
                if (msglines[lVar8][0] != '\0') {
                  bVar17 = L'&' < wVar14;
                  wVar14 = wVar14 + L'\x01';
                  if (bVar17) {
                    wVar14 = L'\0';
                  }
                  lVar8 = (long)wVar14;
                  curline = wVar14;
                  msglines[lVar8][0] = '\0';
                }
                strcpy(msglines[lVar8],wrap_output[lVar9]);
                lVar9 = lVar9 + 1;
              } while (lVar15 != lVar9);
            }
            ui_free_wrap(wrap_output);
            pmVar13 = msghistory;
            wVar14 = histsize;
            wVar11 = histpos;
          }
        }
        wVar12 = wVar12 + L'\x01';
      } while (wVar12 < wVar14);
    }
  }
  pcVar1 = local_50;
  wVar14 = action;
  if (*local_50 == '\0') {
    return;
  }
  if ((prevaction < action) && (skip_more = 0, msglines[curline][0] != '\0')) {
    wVar11 = curline + L'\x01';
    bVar17 = curline < L'\'';
    curline = L'\0';
    if (bVar17) {
      curline = wVar11;
    }
    msglines[curline][0] = '\0';
  }
  prevaction = wVar14;
  prevturn = turn;
  store_message(turn,local_50);
  if (msgwin == (WINDOW *)0x0) {
    wVar14 = L'\xffffffff';
  }
  else {
    sVar10 = 0x4e;
    if (msgwin->_maxx < 0x4e) {
      sVar10 = msgwin->_maxx;
    }
    wVar14 = (short)(sVar10 + 1) + L'\xfffffff8';
    if (msgwin->_maxy != 0) {
      wVar14 = (int)(short)(sVar10 + 1);
    }
  }
  lVar15 = (long)curline;
  pacVar16 = msglines + lVar15;
  if (settings.msg_per_line == '\0') {
    sVar6 = strlen(*pacVar16);
    sVar7 = strlen(pcVar1);
    bVar17 = sVar7 + sVar6 + 2 < (ulong)(long)wVar14;
  }
  else {
    bVar17 = (*pacVar16)[0] == '\0';
  }
  iVar5 = strncmp(pcVar1,"You die",7);
  if ((bVar17) && (iVar5 != 0)) {
    if (msglines[lVar15][0] != '\0') {
      sVar6 = strlen(*pacVar16);
      (*pacVar16 + sVar6)[0] = ' ';
      (*pacVar16 + sVar6)[1] = ' ';
      *(undefined1 *)(lVar15 * 0x51 + 0x1319b2 + sVar6) = 0;
    }
    strcat(*pacVar16,local_50);
  }
  else {
    ui_wrap_text(wVar14,local_50,&local_54,&local_40);
    if (0 < (long)local_54) {
      lVar15 = 0;
      wVar14 = curline;
      do {
        lVar9 = (long)wVar14;
        if (msglines[lVar9][0] != '\0') {
          if ((char)local_48 != '\0') {
            if (msgwin == (WINDOW *)0x0) {
              iVar5 = -3;
            }
            else {
              iVar5 = msgwin->_maxy + -1;
            }
            if (iVar5 < ((wVar14 - last_redraw_curline) + 0x28) % 0x28) {
              more();
              lVar9 = (long)curline;
              wVar14 = curline;
              goto LAB_0010ed64;
            }
          }
          bVar17 = L'&' < wVar14;
          wVar14 = wVar14 + L'\x01';
          if (bVar17) {
            wVar14 = L'\0';
          }
          lVar9 = (long)wVar14;
          curline = wVar14;
          msglines[lVar9][0] = '\0';
        }
LAB_0010ed64:
        strcpy(msglines[lVar9],local_40[lVar15]);
        lVar15 = lVar15 + 1;
      } while (local_54 != lVar15);
    }
    ui_free_wrap(local_40);
  }
  draw_msgwin();
  return;
}

Assistant:

static void curses_print_message_core(int turn, const char *msg, nh_bool canblock)
{
    int hsize, vsize, maxlen;
    nh_bool use_current_line, died;

    if (!msghistory)
	alloc_hist_array();

    if (turn < prevturn) /* going back in time can happen during replay */
	prune_messages(turn);

    if (!*msg)
	return; /* empty message. done. */

    if (action > prevaction) {
	/* re-enable output if it was stopped and start a new line */
	skip_more = FALSE;
	newline();
    }
    prevturn = turn;
    prevaction = action;

    store_message(turn, msg);

    /*
     * generally we want to put as many messages on one line as possible to
     * maximize space usage. A new line is begun after each player turn or if
     * more() is called via pause_messages(). "You die" also deserves its own line.
     *
     * If the message area is only one line high, space for "--More--" must be
     * reserved at the end of the line, otherwise  --More-- is shown on a new line.
     */
    getmaxyx(msgwin, vsize, hsize);
    maxlen = hsize;
    if (maxlen >= COLNO) maxlen = COLNO - 1;
    if (vsize == 1) maxlen -= 8; /* for "--More--" */

    if (settings.msg_per_line) {
	use_current_line = !msglines[curline][0];
    } else {
	use_current_line = (strlen(msglines[curline]) + strlen(msg) + 2 < maxlen);
    }
    died = !strncmp(msg, "You die", 7);
    if (use_current_line && !died) {
	if (msglines[curline][0])
	    strcat(msglines[curline], "  ");
	strcat(msglines[curline], msg);
    } else {
	int i, output_count;
	char **output;

	ui_wrap_text(maxlen, msg, &output_count, &output);

	for (i = 0; i < output_count; i++) {
	    if (msglines[curline][0]) {
		/*
		 * If we would scroll a message off the screen that
		 * the user hasn't had a chance to look at this redraw,
		 * then run more(), else newline().  Because the
		 * --More-- takes up a line by itself, we need to
		 * offset that by one line.  Thus, a message window of
		 * height 2 requires us to always show a --More-- even
		 * if we're on the first message of the redraw; with
		 * height 3, we can safely newline after the first
		 * line of messages but must --More-- after the
		 * second, etc.  getmaxy() gives the height of the window
		 * minus 1, which is why we only subtract 2 not 3.
		 */
		if (canblock &&
		    (curline + MAX_MSGLINES - last_redraw_curline) %
		    MAX_MSGLINES > getmaxy(msgwin) - 2)
		    more();
		else
		    newline();
	    }
	    strcpy(msglines[curline], output[i]);
	}

	ui_free_wrap(output);
    }

    draw_msgwin();
}